

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_id.cc
# Opt level: O0

string * __thiscall Env::DataTypeStr_abi_cxx11_(Env *this,ID *id)

{
  Type *pTVar1;
  undefined8 uVar2;
  string *in_RDI;
  Type *type;
  ID *in_stack_ffffffffffffff80;
  Env *in_stack_ffffffffffffff88;
  string *msg;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffac;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  msg = in_RDI;
  pTVar1 = GetDataType(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (pTVar1 == (Type *)0x0) {
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffa8);
    uVar2 = __cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    Exception::Exception
              ((Exception *)in_stack_ffffffffffffffb0,
               (Object *)CONCAT44(in_stack_ffffffffffffffac,uVar3),msg);
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  (*(pTVar1->super_DataDepElement)._vptr_DataDepElement[0xb])(in_RDI);
  return msg;
}

Assistant:

string Env::DataTypeStr(const ID* id) const
	{
	Type* type = GetDataType(id);
	if ( ! type )
		throw Exception(id, "data type not defined");
	return type->DataTypeStr();
	}